

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

QByteArray * __thiscall
QResource::uncompressedData(QByteArray *__return_storage_ptr__,QResource *this)

{
  QResourcePrivate *this_00;
  qint64 size;
  char *pcVar1;
  __off_t __length;
  
  this_00 = (this->d_ptr).d;
  size = uncompressedSize(this);
  if (size < 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (this_00->compressionAlgo == '\0') {
    QByteArray::fromRawData(__return_storage_ptr__,(char *)this_00->data,size);
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
    pcVar1 = QByteArray::data(__return_storage_ptr__);
    pcVar1 = (char *)QResourcePrivate::decompress(this_00,pcVar1,size);
    if ((long)pcVar1 < 0) {
      QByteArray::clear(__return_storage_ptr__);
    }
    else {
      QByteArray::truncate(__return_storage_ptr__,pcVar1,__length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QResource::uncompressedData() const
{
    Q_D(const QResource);
    qint64 n = uncompressedSize();
    if (n < 0)
        return QByteArray();
    if (n > std::numeric_limits<QByteArray::size_type>::max()) {
        qWarning("QResource: compressed content does not fit into a QByteArray; use QFile instead");
        return QByteArray();
    }
    if (d->compressionAlgo == NoCompression)
        return QByteArray::fromRawData(reinterpret_cast<const char *>(d->data), n);

    // decompress
    QByteArray result(n, Qt::Uninitialized);
    n = d->decompress(result.data(), n);
    if (n < 0)
        result.clear();
    else
        result.truncate(n);
    return result;
}